

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_sah_builder.h
# Opt level: O1

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
bvh::v2::BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL>::get_prim_ids
          (BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL> *this)

{
  return &this->prim_ids_;
}

Assistant:

BVH_ALWAYS_INLINE void fill_bins(
        PerAxisBins& per_axis_bins,
        const BBox& bbox,
        size_t begin,
        size_t end)
    {
        auto bin_scale = Vec(BinCount) / bbox.get_diagonal();
        auto bin_offset = -bbox.min * bin_scale;

        for (size_t i = begin; i < end; ++i) {
            auto pos = fast_mul_add(centers_[prim_ids_[i]], bin_scale, bin_offset);
            static_for<0, Node::dimension>([&] (size_t axis) {
                size_t index = std::min(BinCount - 1,
                    static_cast<size_t>(robust_max(pos[axis], static_cast<Scalar>(0.))));
                per_axis_bins[axis][index].add(bboxes_[prim_ids_[i]]);
            });
        }
    }